

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_internal.h
# Opt level: O0

void __thiscall
absl::lts_20240722::cord_internal::InlineData::set_inline_data(InlineData *this,char *data,size_t n)

{
  char *dst;
  anon_class_1_0_00000001 local_21;
  size_t local_20;
  size_t n_local;
  char *data_local;
  InlineData *this_local;
  
  local_20 = n;
  n_local = (size_t)data;
  data_local = (char *)this;
  if (0xf < n) {
    set_inline_data::anon_class_1_0_00000001::operator()(&local_21);
  }
  unpoison(this);
  Rep::set_tag(&this->rep_,(int8_t)(local_20 << 1));
  dst = Rep::as_chars(&this->rep_);
  SmallMemmove<true>(dst,(char *)n_local,local_20);
  poison(this);
  return;
}

Assistant:

void set_inline_data(const char* data, size_t n) {
    ABSL_ASSERT(n <= kMaxInline);
    unpoison();
    rep_.set_tag(static_cast<int8_t>(n << 1));
    SmallMemmove<true>(rep_.as_chars(), data, n);
    poison();
  }